

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredpointcloud.cc
# Opt level: O2

void __thiscall gvr::ColoredPointCloud::loadPLY(ColoredPointCloud *this,PLYReader *ply)

{
  bool bVar1;
  ply_type pVar2;
  ply_type pVar3;
  ply_type pVar4;
  long lVar5;
  ulong uVar6;
  allocator local_306;
  allocator local_305;
  float local_304;
  string local_300;
  string local_2e0;
  allocator local_2c0;
  allocator local_2bf;
  allocator local_2be;
  allocator local_2bd;
  allocator local_2bc;
  allocator local_2bb;
  allocator local_2ba;
  allocator local_2b9;
  UInt8Receiver cr;
  UInt8Receiver cg;
  FloatArrayReceiver sx;
  FloatArrayReceiver ss;
  FloatArrayReceiver sy;
  FloatArrayReceiver se;
  UInt8Receiver cb;
  FloatArrayReceiver vx;
  FloatArrayReceiver vy;
  FloatArrayReceiver sc;
  FloatArrayReceiver vz;
  FloatArrayReceiver sz;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&vx,"vertex",(allocator *)&vy);
  lVar5 = PLYReader::instancesOfElement(ply,(string *)&vx);
  std::__cxx11::string::~string((string *)&vx);
  Model::setOriginFromPLY((Model *)this,ply);
  std::__cxx11::string::string((string *)&vx,"vertex",(allocator *)&se);
  std::__cxx11::string::string((string *)&vy,"scan_size",(allocator *)&sc);
  pVar2 = PLYReader::getTypeOfProperty(ply,(string *)&vx,(string *)&vy);
  uVar6 = 1;
  if (pVar2 == ply_none) {
    std::__cxx11::string::string((string *)&local_50,"vertex",&local_2b9);
    std::__cxx11::string::string((string *)&local_70,"scan_error",&local_2ba);
    pVar3 = PLYReader::getTypeOfProperty(ply,&local_50,&local_70);
    if (pVar3 != ply_none) goto LAB_0012a750;
    std::__cxx11::string::string((string *)&local_90,"vertex",&local_2bb);
    std::__cxx11::string::string((string *)&local_b0,"scan_conf",&local_2bc);
    pVar3 = PLYReader::getTypeOfProperty(ply,&local_90,&local_b0);
    uVar6 = (ulong)(pVar3 != ply_none);
    local_304 = (float)CONCAT71((uint7)(uint3)(pVar3 >> 8),1);
  }
  else {
LAB_0012a750:
    local_304 = 0.0;
  }
  std::__cxx11::string::string((string *)&vz,"vertex",(allocator *)&sx);
  std::__cxx11::string::string((string *)&ss,"sx",(allocator *)&sy);
  pVar3 = PLYReader::getTypeOfProperty(ply,(string *)&vz,(string *)&ss);
  if (pVar3 != ply_none) {
    std::__cxx11::string::string((string *)&local_d0,"vertex",&local_2bd);
    std::__cxx11::string::string((string *)&local_f0,"sy",&local_2be);
    pVar4 = PLYReader::getTypeOfProperty(ply,&local_d0,&local_f0);
    if (pVar4 != ply_none) {
      std::__cxx11::string::string((string *)&local_110,"vertex",&local_2bf);
      std::__cxx11::string::string((string *)&local_130,"sz",&local_2c0);
      PLYReader::getTypeOfProperty(ply,&local_110,&local_130);
      bVar1 = true;
      goto LAB_0012a859;
    }
  }
  bVar1 = false;
LAB_0012a859:
  (*(this->super_PointCloud).super_Model._vptr_Model[9])(this,lVar5,uVar6);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
  }
  if (pVar3 != ply_none) {
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&vz);
  if (local_304._0_1_ != '\0') {
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (pVar2 == ply_none) {
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&vy);
  std::__cxx11::string::~string((string *)&vx);
  FloatArrayReceiver::FloatArrayReceiver(&vx,(this->super_PointCloud).vertex,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&vy,(this->super_PointCloud).vertex,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&vz,(this->super_PointCloud).vertex,3,2);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"x",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vx.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"y",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vy.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"z",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vz.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  FloatArrayReceiver::FloatArrayReceiver(&ss,(this->super_PointCloud).scanprop,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&se,(this->super_PointCloud).scanprop,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&sc,(this->super_PointCloud).scanprop,3,2);
  if ((this->super_PointCloud).scanprop != (float *)0x0) {
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_size",(allocator *)&cr);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&ss.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_error",(allocator *)&cr);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&se.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_conf",(allocator *)&cr);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&sc.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
  }
  FloatArrayReceiver::FloatArrayReceiver(&sx,(this->super_PointCloud).scanpos,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&sy,(this->super_PointCloud).scanpos,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&sz,(this->super_PointCloud).scanpos,3,2);
  if ((this->super_PointCloud).scanpos != (float *)0x0) {
    std::__cxx11::string::string((string *)&cr,"vertex",(allocator *)&cb);
    std::__cxx11::string::string((string *)&cg,"sx",(allocator *)&local_300);
    PLYReader::setReceiver(ply,(string *)&cr,(string *)&cg,&sx.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&cg);
    std::__cxx11::string::~string((string *)&cr);
    std::__cxx11::string::string((string *)&cr,"vertex",(allocator *)&cb);
    std::__cxx11::string::string((string *)&cg,"sy",(allocator *)&local_300);
    PLYReader::setReceiver(ply,(string *)&cr,(string *)&cg,&sy.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&cg);
    std::__cxx11::string::~string((string *)&cr);
    std::__cxx11::string::string((string *)&cr,"vertex",(allocator *)&cb);
    std::__cxx11::string::string((string *)&cg,"sz",(allocator *)&local_300);
    PLYReader::setReceiver(ply,(string *)&cr,(string *)&cg,&sz.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&cg);
    std::__cxx11::string::~string((string *)&cr);
  }
  std::__cxx11::string::string((string *)&cr,"vertex",(allocator *)&cb);
  std::__cxx11::string::string((string *)&cg,"diffuse_red",(allocator *)&local_300);
  pVar2 = PLYReader::getTypeOfProperty(ply,(string *)&cr,(string *)&cg);
  std::__cxx11::string::~string((string *)&cg);
  std::__cxx11::string::~string((string *)&cr);
  if (pVar2 == ply_none) {
    std::__cxx11::string::string((string *)&cr,"vertex",(allocator *)&cb);
    std::__cxx11::string::string((string *)&cg,"red",(allocator *)&local_300);
    pVar2 = PLYReader::getTypeOfProperty(ply,(string *)&cr,(string *)&cg);
    std::__cxx11::string::~string((string *)&cg);
    std::__cxx11::string::~string((string *)&cr);
    if (pVar2 == ply_none) {
      std::__cxx11::string::string((string *)&cr,"vertex",(allocator *)&cb);
      std::__cxx11::string::string((string *)&cg,"r",(allocator *)&local_300);
      pVar2 = PLYReader::getTypeOfProperty(ply,(string *)&cr,(string *)&cg);
      std::__cxx11::string::~string((string *)&cg);
      std::__cxx11::string::~string((string *)&cr);
    }
  }
  if (pVar2 - ply_float32 < 2) {
    local_304 = 255.0;
  }
  else {
    local_304 = *(float *)(&DAT_0015be8c + (ulong)(pVar2 == ply_uint16) * 4);
  }
  UInt8Receiver::UInt8Receiver(&cr,this->rgb,0,local_304);
  UInt8Receiver::UInt8Receiver(&cg,this->rgb,1,local_304);
  UInt8Receiver::UInt8Receiver(&cb,this->rgb,2,local_304);
  std::__cxx11::string::string((string *)&local_300,"vertex",&local_305);
  std::__cxx11::string::string((string *)&local_2e0,"diffuse_red",&local_306);
  PLYReader::setReceiver(ply,&local_300,&local_2e0,&cr.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::string((string *)&local_300,"vertex",&local_305);
  std::__cxx11::string::string((string *)&local_2e0,"diffuse_green",&local_306);
  PLYReader::setReceiver(ply,&local_300,&local_2e0,&cg.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::string((string *)&local_300,"vertex",&local_305);
  std::__cxx11::string::string((string *)&local_2e0,"diffuse_blue",&local_306);
  PLYReader::setReceiver(ply,&local_300,&local_2e0,&cb.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::string((string *)&local_300,"vertex",&local_305);
  std::__cxx11::string::string((string *)&local_2e0,"red",&local_306);
  PLYReader::setReceiver(ply,&local_300,&local_2e0,&cr.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::string((string *)&local_300,"vertex",&local_305);
  std::__cxx11::string::string((string *)&local_2e0,"green",&local_306);
  PLYReader::setReceiver(ply,&local_300,&local_2e0,&cg.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::string((string *)&local_300,"vertex",&local_305);
  std::__cxx11::string::string((string *)&local_2e0,"blue",&local_306);
  PLYReader::setReceiver(ply,&local_300,&local_2e0,&cb.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::string((string *)&local_300,"vertex",&local_305);
  std::__cxx11::string::string((string *)&local_2e0,"r",&local_306);
  PLYReader::setReceiver(ply,&local_300,&local_2e0,&cr.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::string((string *)&local_300,"vertex",&local_305);
  std::__cxx11::string::string((string *)&local_2e0,"g",&local_306);
  PLYReader::setReceiver(ply,&local_300,&local_2e0,&cg.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::string((string *)&local_300,"vertex",&local_305);
  std::__cxx11::string::string((string *)&local_2e0,"b",&local_306);
  PLYReader::setReceiver(ply,&local_300,&local_2e0,&cb.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  PLYReader::readData(ply);
  return;
}

Assistant:

void ColoredPointCloud::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // set receiver for point cloud

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  // set receiver for color

  float scale=1.0f;
  ply_type type=ply.getTypeOfProperty("vertex", "diffuse_red");

  if (type == ply_none)
  {
    type=ply.getTypeOfProperty("vertex", "red");
  }

  if (type == ply_none)
  {
    type=ply.getTypeOfProperty("vertex", "r");
  }

  if (type == ply_uint16)
  {
    scale=1.0f/256;
  }

  if (type == ply_float32 || type == ply_float64)
  {
    scale=255;
  }

  UInt8Receiver cr(getColorArray(), 0, scale), cg(getColorArray(), 1, scale), cb(getColorArray(), 2,
      scale);

  ply.setReceiver("vertex", "diffuse_red", &cr);
  ply.setReceiver("vertex", "diffuse_green", &cg);
  ply.setReceiver("vertex", "diffuse_blue", &cb);

  ply.setReceiver("vertex", "red", &cr);
  ply.setReceiver("vertex", "green", &cg);
  ply.setReceiver("vertex", "blue", &cb);

  ply.setReceiver("vertex", "r", &cr);
  ply.setReceiver("vertex", "g", &cg);
  ply.setReceiver("vertex", "b", &cb);

  // read data

  ply.readData();
}